

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  int iDepth;
  long in_FS_OFFSET;
  RowSetEntry *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = pList->pRight;
  pList->pRight = (RowSetEntry *)0x0;
  pList->pLeft = (RowSetEntry *)0x0;
  iDepth = 1;
  while (pRVar1 = pRVar2, pRVar1 != (RowSetEntry *)0x0) {
    local_28 = pRVar1->pRight;
    pRVar1->pLeft = pList;
    pRVar2 = rowSetNDeepTree(&local_28,iDepth);
    pRVar1->pRight = pRVar2;
    iDepth = iDepth + 1;
    pRVar2 = local_28;
    pList = pRVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pList;
  }
  __stack_chk_fail();
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}